

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::ScanScalarEndInFlow(void)

{
  int iVar1;
  RegEx *ex1;
  RegEx *ex1_00;
  RegEx local_50;
  RegEx local_30;
  
  if (ScanScalarEndInFlow()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&ScanScalarEndInFlow()::e);
    if (iVar1 != 0) {
      ex1 = EndScalarInFlow();
      ex1_00 = BlankOrBreak();
      Comment();
      operator+(&local_30,ex1_00,&local_50);
      operator|(&ScanScalarEndInFlow::e,ex1,&local_30);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_30.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_50.m_params);
      __cxa_atexit(RegEx::~RegEx,&ScanScalarEndInFlow::e,&__dso_handle);
      __cxa_guard_release(&ScanScalarEndInFlow()::e);
    }
  }
  return &ScanScalarEndInFlow::e;
}

Assistant:

inline const RegEx& ScanScalarEndInFlow() {
  static const RegEx e = (EndScalarInFlow() | (BlankOrBreak() + Comment()));
  return e;
}